

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_adj(Omega_h *this,Mesh *mesh,Int from_dim,Int to_dim,Read<signed_char> *from_marked)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Write<signed_char> *this_00;
  Read<signed_char> RVar2;
  Write<signed_char> WStack_48;
  Write<signed_char> local_38;
  
  this_00 = &WStack_48;
  if (from_dim == to_dim) {
    Write<signed_char>::Write((Write<signed_char> *)this,&from_marked->write_);
    pvVar1 = extraout_RDX;
  }
  else {
    if (from_dim < to_dim) {
      Write<signed_char>::Write(&local_38,&from_marked->write_);
      mark_up(this,mesh,from_dim,to_dim,(Read<signed_char> *)&local_38);
      this_00 = &local_38;
    }
    else {
      if (from_dim <= to_dim) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
             ,0x45);
      }
      Write<signed_char>::Write(&WStack_48,&from_marked->write_);
      mark_down(this,mesh,from_dim,to_dim,(Read<signed_char> *)&WStack_48);
    }
    Write<signed_char>::~Write(this_00);
    pvVar1 = extraout_RDX_00;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_adj(Mesh* mesh, Int from_dim, Int to_dim, Read<I8> from_marked) {
  if (from_dim == to_dim) return from_marked;
  if (from_dim < to_dim) return mark_up(mesh, from_dim, to_dim, from_marked);
  if (from_dim > to_dim) return mark_down(mesh, from_dim, to_dim, from_marked);
  OMEGA_H_NORETURN(Read<I8>());
}